

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::LogFile(LogFile *this,string *filename)

{
  int iVar1;
  char *__file;
  ostream *this_00;
  string *filename_local;
  LogFile *this_local;
  
  std::queue<char*,std::deque<char*,std::allocator<char*>>>::
  queue<std::deque<char*,std::allocator<char*>>,void>
            ((queue<char*,std::deque<char*,std::allocator<char*>>> *)this);
  std::queue<char*,std::deque<char*,std::allocator<char*>>>::
  queue<std::deque<char*,std::allocator<char*>>,void>
            ((queue<char*,std::deque<char*,std::allocator<char*>>> *)&this->Wait_WriteTask);
  pthread_mutex_init((pthread_mutex_t *)&this->put_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->get_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->get_Cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->Swap_Cond,(pthread_condattr_t *)0x0);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0x442);
  this->fd = iVar1;
  if (this->fd < 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"LofFile open fail");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/LogFile.cpp"
                  ,0xd,"LogFile::LogFile(string)");
  }
  return;
}

Assistant:

LogFile::LogFile(string filename)
{
    pthread_mutex_init(&put_Mutex,NULL);
    pthread_mutex_init(&get_Mutex,NULL);
    pthread_cond_init(&get_Cond,NULL);
    pthread_cond_init(&Swap_Cond,NULL);
    fd = open(filename.c_str(),O_RDWR | O_APPEND | O_CREAT);
    if(fd < 0)
    {
        cout<<"LofFile open fail"<<endl;
        assert(0);
    }
}